

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallScriptGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallScriptGenerator::GenerateScriptForConfig
          (cmInstallScriptGenerator *this,ostream *os,string *config,Indent indent)

{
  cmLocalGenerator *lg;
  __shared_count<(__gnu_cxx::_Lock_policy)2> config_00;
  pointer this_00;
  string *script;
  string local_88;
  Indent local_64;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmListFileBacktrace local_48;
  undefined1 local_38 [8];
  cmGeneratorExpression ge;
  string *config_local;
  ostream *os_local;
  cmInstallScriptGenerator *this_local;
  Indent indent_local;
  
  ge.Backtrace.TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)config;
  if ((this->AllowGenex & 1U) == 0) {
    AddScriptInstallRule(this,os,indent,&this->Script);
  }
  else {
    local_48.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_48.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace(&local_48);
    cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_38,&local_48);
    cmListFileBacktrace::~cmListFileBacktrace(&local_48);
    cmGeneratorExpression::Parse
              ((cmGeneratorExpression *)&stack0xffffffffffffffa0,(string *)local_38);
    local_64.Level = indent.Level;
    this_00 = std::
              unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                            *)&stack0xffffffffffffffa0);
    config_00 = ge.Backtrace.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
    lg = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_88);
    script = cmCompiledGeneratorExpression::Evaluate
                       (this_00,lg,(string *)config_00._M_pi,false,(cmGeneratorTarget *)0x0,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,&local_88);
    AddScriptInstallRule(this,os,local_64,script);
    std::__cxx11::string::~string((string *)&local_88);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)&stack0xffffffffffffffa0);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_38);
  }
  return;
}

Assistant:

void cmInstallScriptGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  if (this->AllowGenex) {
    cmGeneratorExpression ge;
    std::unique_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(this->Script);
    this->AddScriptInstallRule(os, indent,
                               cge->Evaluate(this->LocalGenerator, config));
  } else {
    this->AddScriptInstallRule(os, indent, this->Script);
  }
}